

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall gl4cts::DirectStateAccess::Textures::CopyTest::Test<3u>(CopyTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  GLenum target;
  uint local_18;
  bool local_11;
  GLuint i;
  bool result;
  CopyTest *this_local;
  
  CreateAll<3u>(this);
  local_11 = true;
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    bVar1 = CopyTextureSubImage3DAndCheckErrors(this,this->m_to_dst,0,0,0,local_18,0,0,2,2);
    bVar2 = CopyTextureSubImage3DAndCheckErrors(this,this->m_to_dst,0,2,0,local_18,2,0,2,2);
    bVar3 = CopyTextureSubImage3DAndCheckErrors(this,this->m_to_dst,0,0,2,local_18,0,2,2,2);
    bVar4 = CopyTextureSubImage3DAndCheckErrors(this,this->m_to_dst,0,2,2,local_18,2,2,2,2);
    local_11 = (((local_11 & bVar1) != 0 && bVar2) && bVar3) && bVar4;
  }
  target = TextureTarget<3u>(this);
  bVar1 = CheckData(this,target,0x100);
  CleanAll(this);
  return (local_11 & bVar1) != 0;
}

Assistant:

bool CopyTest::Test<3>()
{
	CreateAll<3>();

	bool result = true;

	for (glw::GLuint i = 0; i < s_texture_depth; ++i)
	{
		result &=
			CopyTextureSubImage3DAndCheckErrors(m_to_dst, 0, 0, 0, i, 0, 0, s_texture_width / 2, s_texture_height / 2);
		result &= CopyTextureSubImage3DAndCheckErrors(m_to_dst, 0, s_texture_width / 2, 0, i, s_texture_width / 2, 0,
													  s_texture_width / 2, s_texture_height / 2);
		result &= CopyTextureSubImage3DAndCheckErrors(m_to_dst, 0, 0, s_texture_height / 2, i, 0, s_texture_height / 2,
													  s_texture_width / 2, s_texture_height / 2);
		result &= CopyTextureSubImage3DAndCheckErrors(m_to_dst, 0, s_texture_width / 2, s_texture_height / 2, i,
													  s_texture_width / 2, s_texture_height / 2, s_texture_width / 2,
													  s_texture_height / 2);
	}

	result &= CheckData(TextureTarget<3>(), 4 /* RGBA */ * s_texture_width * s_texture_height * s_texture_depth);

	CleanAll();

	return result;
}